

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p.h
# Opt level: O1

void QtPrivate::
     QPrivateSlotObject<void_(QTextEditPrivate::*)(const_QRectF_&),_QtPrivate::List<const_QRectF_&>,_void>
     ::impl(int which,QSlotObjectBase *this_,QObject *r,void **a,bool *ret)

{
  code *UNRECOVERED_JUMPTABLE;
  
  if (which == 2) {
    *ret = ((ImplFn)a[1] == this_[1].m_impl || *a == (void *)0x0) && *a == *(void **)(this_ + 1);
  }
  else {
    if (which == 1) {
      UNRECOVERED_JUMPTABLE = *(code **)(this_ + 1);
      if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
        UNRECOVERED_JUMPTABLE =
             *(code **)(UNRECOVERED_JUMPTABLE + *(long *)(this_[1].m_impl + *(long *)(r + 8)) + -1);
      }
      (*UNRECOVERED_JUMPTABLE)(this_[1].m_impl + *(long *)(r + 8),a[1],r,a,UNRECOVERED_JUMPTABLE);
      return;
    }
    if ((which == 0) && (this_ != (QSlotObjectBase *)0x0)) {
      operator_delete(this_,0x20);
      return;
    }
  }
  return;
}

Assistant:

static void impl(QSlotObjectBase *this_, QObject *r, void **a, int which, bool *ret)
#endif
    {
        const auto that = static_cast<QPrivateSlotObject*>(this_);
        switch (which) {
            case Destroy:
                delete that;
                break;
            case Call:
                FuncType::template call<Args, R>(that->object(),
                                                 static_cast<typename FuncType::Object *>(QObjectPrivate::get(r)), a);
                break;
            case Compare:
                *ret = *reinterpret_cast<Func *>(a) == that->object();
                break;
            case NumOperations: ;
        }
    }